

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_> *
__thiscall
Corrade::Utility::String::parseNumberSequence
          (Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_>
           *__return_storage_ptr__,String *this,StringView string,uint32_t min,uint32_t max)

{
  StringView value;
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  Debug *pDVar5;
  type *this_00;
  Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *value_00;
  ArrayView<unsigned_int> AVar6;
  uint local_18c;
  uint local_164;
  StringViewFlags local_f8;
  StringView local_f0;
  Flags local_d9;
  Error local_d8;
  ulong local_b0;
  uint64_t next;
  uint32_t *j;
  uint *__end7;
  uint *__begin7;
  ArrayView<unsigned_int> local_88;
  ArrayView<unsigned_int> *local_78;
  ArrayView<unsigned_int> *__range7;
  char local_65;
  uint32_t rangeEnd;
  char c;
  ulong local_58;
  size_t i;
  uint32_t rangeStart;
  bool overflow;
  uint32_t number;
  bool hasNumber;
  Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> out;
  uint32_t max_local;
  uint32_t min_local;
  StringView string_local;
  
  string_local._data = string._data;
  out._deleter._4_4_ = (uint)string._sizePlusFlags;
  out._deleter._0_4_ = min;
  _max_local = this;
  string_local._sizePlusFlags = (size_t)__return_storage_ptr__;
  Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::Array
            ((Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)&number);
  overflow = false;
  rangeStart = 0;
  i._7_1_ = 0;
  i._0_4_ = 0xffffffff;
  local_58 = 0;
  do {
    uVar1 = local_58;
    sVar3 = Containers::BasicStringView<const_char>::size((BasicStringView<const_char> *)&max_local)
    ;
    uVar2 = local_58;
    if (sVar3 < uVar1) {
      this_00 = move<Corrade::Containers::Array<unsigned_int,void(*)(unsigned_int*,unsigned_long)>&>
                          ((Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)&number);
      Containers::
      optional<Corrade::Containers::Array<unsigned_int,void(*)(unsigned_int*,unsigned_long)>>
                (__return_storage_ptr__,(Containers *)this_00,value_00);
LAB_001466ea:
      Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::~Array
                ((Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)&number);
      return __return_storage_ptr__;
    }
    sVar3 = Containers::BasicStringView<const_char>::size((BasicStringView<const_char> *)&max_local)
    ;
    if (uVar2 == sVar3) {
      local_65 = '\0';
    }
    else {
      pcVar4 = Containers::BasicStringView<const_char>::operator[]
                         ((BasicStringView<const_char> *)&max_local,local_58);
      local_65 = *pcVar4;
    }
    uVar1 = local_58;
    sVar3 = Containers::BasicStringView<const_char>::size((BasicStringView<const_char> *)&max_local)
    ;
    if ((((((uVar1 == sVar3) || (local_65 == ',')) || (local_65 == ';')) ||
         ((local_65 == ' ' || (local_65 == '\t')))) ||
        ((local_65 == '\f' || ((local_65 == '\v' || (local_65 == '\r')))))) || (local_65 == '\n')) {
      if ((i._7_1_ & 1) == 0) {
        if ((uint)i == 0xffffffff) {
          if ((((overflow & 1U) != 0) && (out._deleter._4_4_ <= rangeStart)) &&
             (rangeStart < (uint32_t)out._deleter)) {
            Containers::
            arrayAppend<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                      ((Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)&number,
                       &rangeStart);
          }
        }
        else {
          if (((overflow & 1U) == 0) || ((uint32_t)out._deleter <= rangeStart)) {
            local_164 = (uint32_t)out._deleter;
          }
          else {
            local_164 = rangeStart + 1;
          }
          __range7._4_4_ = local_164;
          if ((uint)i < local_164) {
            AVar6 = Containers::
                    arrayAppend<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                              (&number,local_164 - (uint)i);
            local_78 = &local_88;
            local_88 = AVar6;
            __end7 = Containers::ArrayView<unsigned_int>::begin(local_78);
            j = Containers::ArrayView<unsigned_int>::end(local_78);
            for (; __end7 != j; __end7 = __end7 + 1) {
              next = (uint64_t)__end7;
              *__end7 = (uint)i;
              i._0_4_ = (uint)i + 1;
            }
          }
          i._0_4_ = 0xffffffff;
        }
      }
      else {
        i._7_1_ = 0;
      }
      overflow = false;
      rangeStart = 0;
    }
    else if ((local_65 < '0') || ('9' < local_65)) {
      if (local_65 != '-') {
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_d9);
        Error::Error(&local_d8,local_d9);
        pDVar5 = Debug::operator<<(&local_d8.super_Debug,
                                   "Utility::parseNumberSequence(): unrecognized character");
        Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
                  (&local_f8);
        Containers::BasicStringView<const_char>::BasicStringView(&local_f0,&local_65,1,local_f8);
        pDVar5 = Debug::operator<<(pDVar5,local_f0);
        pDVar5 = Debug::operator<<(pDVar5,"in");
        value._sizePlusFlags = (size_t)string_local._data;
        value._data = (char *)_max_local;
        Debug::operator<<(pDVar5,value);
        Error::~Error(&local_d8);
        Containers::
        Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_>
        ::Optional(__return_storage_ptr__);
        goto LAB_001466ea;
      }
      if (((overflow & 1U) == 0) || (rangeStart < out._deleter._4_4_)) {
        local_18c = out._deleter._4_4_;
      }
      else {
        local_18c = rangeStart;
      }
      i._0_4_ = local_18c;
      overflow = false;
      rangeStart = 0;
    }
    else {
      overflow = true;
      local_b0 = (ulong)rangeStart * 10 + (long)(local_65 + -0x30);
      if (0xffffffff < local_b0) {
        i._7_1_ = 1;
      }
      rangeStart = (uint32_t)local_b0;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

Containers::Optional<Containers::Array<std::uint32_t>> parseNumberSequence(const Containers::StringView string, const std::uint32_t min, const std::uint32_t max) {
    Containers::Array<std::uint32_t> out;

    bool hasNumber = false; /* whether we have a number already */
    std::uint32_t number = 0; /* value of that number */
    bool overflow = false; /* if we've overflown the 32 bits during parsing */
    std::uint32_t rangeStart = ~0u; /* if not ~0u, we're in a range */

    /* Going through one iteration more in order to handle the end-of-string
       condition in the same place as delimiters */
    for(std::size_t i = 0; i <= string.size(); ++i) {
        const char c = i == string.size() ? 0 : string[i];

        /* End of string or a delimiter */
        if(i == string.size() || c == ',' || c == ';' || c == ' ' || c == '\t' || c == '\f' || c == '\v' || c == '\r' || c == '\n') {
            /* If anything has overflown, ignore this piece completely and
               reset the bit again */
            if(overflow) {
                overflow = false;

            /* If we are in a range, fill it. Clamp range end to the soecified
               bounds as well, worst case the loop will not iterate at all. */
            } else if(rangeStart != ~std::uint32_t{}) {
                const std::uint32_t rangeEnd = hasNumber && number < max ? number + 1 : max;

                /* If the range is non-empty, add an uninitialized sequence to
                   the array and then fill it. Should be vastly more efficient
                   for large ranges than arrayAppend() in a loop. */
                if(rangeEnd > rangeStart)
                    for(std::uint32_t& j: arrayAppend(out, NoInit, rangeEnd - rangeStart))
                        j = rangeStart++;
                rangeStart = ~std::uint32_t{};

            /* Otherwise, if we have just one number, save it to the output if
               it's in bounds.*/
            } else if(hasNumber && number >= min && number < max) {
                arrayAppend(out, number);

            /* If we have nothing, there was multiple delimiters after each
               other. */
            }

            hasNumber = false;
            number = 0;

        /* Number */
        } else if(c >= '0' && c <= '9') {
            hasNumber = true;

            /* If there's an overflow, remember that to discard the whole piece
               later. Apparently I can't actually test for overflow with
               `number < next` (huh? why did I think it would work?) so going
               with a bigger type for the multiplication. Answers at
               https://stackoverflow.com/a/1815371 are mostly just crap, using
               a *division* to test if a multiplication overflowed?! */
            const std::uint64_t next = std::uint64_t{number}*10 + (c - '0');
            if(next > ~std::uint32_t{}) overflow = true;

            number = next;

        /* Range specification */
        } else if(c == '-') {
            /* If we have a number, remember it as a range start if it's in
               bounds. Otherwise use the min value. */
            rangeStart = hasNumber && number >= min ? number : min;

            hasNumber = false;
            number = 0;

        /* Something weird, bail */
        } else {
            /** @todo sanitize when Debug::chr / Debug::str is done */
            Error{} << "Utility::parseNumberSequence(): unrecognized character" << Containers::StringView{&c, 1} << "in" << string;
            return {};
        }
    }

    /* GCC 4.8 decases when seeing just `return out` here */
    return Containers::optional(Utility::move(out));
}